

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_migrate.c
# Opt level: O2

REF_STATUS ref_migrate_free(REF_MIGRATE ref_migrate)

{
  uint uVar1;
  undefined8 uVar2;
  REF_STATUS RVar3;
  ulong uVar4;
  
  if (ref_migrate == (REF_MIGRATE)0x0) {
    RVar3 = 2;
  }
  else {
    free(ref_migrate->age);
    free(ref_migrate->weight);
    free(ref_migrate->xyz);
    free(ref_migrate->global);
    uVar1 = ref_adj_free(ref_migrate->conn);
    if (uVar1 == 0) {
      uVar1 = ref_adj_free(ref_migrate->parent_part);
      if (uVar1 == 0) {
        uVar1 = ref_adj_free(ref_migrate->parent_local);
        if (uVar1 == 0) {
          free(ref_migrate);
          return 0;
        }
        uVar4 = (ulong)uVar1;
        uVar2 = 0x83;
      }
      else {
        uVar4 = (ulong)uVar1;
        uVar2 = 0x82;
      }
    }
    else {
      uVar4 = (ulong)uVar1;
      uVar2 = 0x81;
    }
    RVar3 = (REF_STATUS)uVar4;
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",uVar2
           ,"ref_migrate_free",uVar4,"free adj");
  }
  return RVar3;
}

Assistant:

REF_FCN REF_STATUS ref_migrate_free(REF_MIGRATE ref_migrate) {
  if (NULL == (void *)ref_migrate) return REF_NULL;

  ref_free(ref_migrate->age);
  ref_free(ref_migrate->weight);
  ref_free(ref_migrate->xyz);
  ref_free(ref_migrate->global);

  RSS(ref_adj_free(ref_migrate_conn(ref_migrate)), "free adj");
  RSS(ref_adj_free(ref_migrate_parent_part(ref_migrate)), "free adj");
  RSS(ref_adj_free(ref_migrate_parent_local(ref_migrate)), "free adj");

  ref_free(ref_migrate);

  return REF_SUCCESS;
}